

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

void __thiscall comparer_context::cmp_bounds<aiQuatKey>(comparer_context *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  aiQuatKey local_30;
  
  std::operator+(&local_50,name,".<minimum-value>");
  cmp<aiQuatKey>(&local_30,this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+(&local_50,name,".<maximum-value>");
  cmp<aiQuatKey>(&local_30,this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmp_bounds(const std::string& name) {
        cmp<T> (name+".<minimum-value>");
        cmp<T> (name+".<maximum-value>");
    }